

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

CaseGenerateSyntax * __thiscall
slang::parsing::Parser::parseCaseGenerateConstruct(Parser *this,AttrList attributes)

{
  SyntaxFactory *this_00;
  bool bVar1;
  int iVar2;
  ExpressionSyntax *condition;
  SourceLocation SVar3;
  ExpressionSyntax *pEVar4;
  Diagnostic *this_01;
  DefaultCaseItemSyntax *pDVar5;
  undefined4 extraout_var;
  MemberSyntax *pMVar6;
  StandardCaseItemSyntax *pSVar7;
  undefined4 extraout_var_00;
  CaseGenerateSyntax *pCVar8;
  Info *in_RCX;
  Info *pIVar9;
  Info *extraout_RDX;
  Info *pIVar10;
  Token *ctx;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> *attributes_00;
  TokenKind TVar11;
  TokenKind TVar12;
  ulong uVar13;
  Token openParen;
  Token closeParen;
  Token TVar14;
  Token TVar15;
  SourceLocation local_220;
  Token local_210;
  ulong local_200;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1f8;
  ulong local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d0;
  Token keyword;
  Token current;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  SmallVector<slang::syntax::CaseItemSyntax_*,_5UL> itemBuffer;
  
  keyword = ParserBase::consume(&this->super_ParserBase);
  openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  condition = parseExpression(this);
  closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  itemBuffer.super_SmallVectorBase<slang::syntax::CaseItemSyntax_*>.data_ =
       (pointer)itemBuffer.super_SmallVectorBase<slang::syntax::CaseItemSyntax_*>.firstElement;
  itemBuffer.super_SmallVectorBase<slang::syntax::CaseItemSyntax_*>.len = 0;
  itemBuffer.super_SmallVectorBase<slang::syntax::CaseItemSyntax_*>.cap = 5;
  this_00 = &this->factory;
  local_220 = (SourceLocation)0x0;
  local_200 = 0;
  do {
    while( true ) {
      TVar14 = ParserBase::peek(&this->super_ParserBase);
      if (TVar14.kind != DefaultKeyword) break;
      if (((ulong)local_220 & 0xfffffff) != 0 && (local_200 & 1) == 0) {
        buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
             ParserBase::peek(&this->super_ParserBase);
        SVar3 = Token::location((Token *)&buffer);
        this_01 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x810005,SVar3);
        local_200 = CONCAT71((int7)((ulong)in_RCX >> 8),1);
        Diagnostic::addNote(this_01,(DiagCode)0xa0001,local_220);
      }
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
           ParserBase::peek(&this->super_ParserBase);
      local_220 = Token::location((Token *)&buffer);
      TVar14 = ParserBase::consume(&this->super_ParserBase);
      TVar15 = ParserBase::consumeIf(&this->super_ParserBase,Colon);
      in_RCX = TVar15._0_8_;
      pMVar6 = parseGenerateBlock(this);
      pDVar5 = slang::syntax::SyntaxFactory::defaultCaseItem
                         (this_00,TVar14,TVar15,&pMVar6->super_SyntaxNode);
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)pDVar5;
      SmallVectorBase<slang::syntax::CaseItemSyntax*>::emplace_back<slang::syntax::CaseItemSyntax*>
                ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)&itemBuffer,
                 (CaseItemSyntax **)&buffer);
    }
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar14.kind);
    if (!bVar1) {
      if (itemBuffer.super_SmallVectorBase<slang::syntax::CaseItemSyntax_*>.len == 0) {
        SVar3 = Token::location(&keyword);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x40005,SVar3);
      }
      TVar15 = ParserBase::expect(&this->super_ParserBase,EndCaseKeyword);
      TVar14 = keyword;
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len._0_4_ = 1;
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 0;
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[1] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[2] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[3] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[4] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[5] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[6] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[7] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
           (pointer)&PTR_getChild_00593670;
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._8_8_ =
           attributes._M_extent._M_extent_value._M_extent_value;
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._16_8_ =
           attributes._M_ptr;
      buffer.stackBase._0_8_ = attributes._M_extent._M_extent_value._M_extent_value;
      iVar2 = SmallVectorBase<slang::syntax::CaseItemSyntax_*>::copy
                        (&itemBuffer.super_SmallVectorBase<slang::syntax::CaseItemSyntax_*>,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)TVar15.info)
      ;
      local_1d0 = CONCAT44(extraout_var_00,iVar2);
      local_1f8._8_4_ = 1;
      local_1e8 = 0;
      uStack_1e0 = 0;
      local_1f8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_00596598
      ;
      attributes_00 = &buffer;
      pCVar8 = slang::syntax::SyntaxFactory::caseGenerate
                         (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                  attributes_00,TVar14,openParen,condition,closeParen,
                          (SyntaxList<slang::syntax::CaseItemSyntax> *)&local_1f8._M_first,TVar15);
      SmallVectorBase<slang::syntax::CaseItemSyntax_*>::cleanup
                (&itemBuffer.super_SmallVectorBase<slang::syntax::CaseItemSyntax_*>,
                 (EVP_PKEY_CTX *)attributes_00);
      return pCVar8;
    }
    Token::Token(&local_210);
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
         (pointer)buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
    TVar14 = ParserBase::peek(&this->super_ParserBase);
    current = TVar14;
    bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar14.kind);
    if (bVar1) {
      bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar1) {
        SVar3 = Token::location(&current);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar3);
      }
      local_210 = ParserBase::expect(&this->super_ParserBase,Colon);
LAB_0035bd1f:
      pIVar10 = local_210.info;
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar14.kind);
      if (bVar1) {
        do {
          do {
            pIVar10 = TVar14.info;
            pEVar4 = parseExpression(this);
            local_1f8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar4;
            local_1e8 = CONCAT71(local_1e8._1_7_,1);
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                       (TokenOrSyntax *)&local_1f8._M_first);
            TVar15 = ParserBase::peek(&this->super_ParserBase);
            TVar11 = TVar15.kind;
            bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar11);
            if (TVar11 == EndOfFile || bVar1) goto LAB_0035bd14;
            if (TVar11 != Comma) {
              ParserBase::expect(&this->super_ParserBase,Comma);
              do {
                bVar1 = ParserBase::
                        skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                  (&this->super_ParserBase,(DiagCode)0x10001,false);
                if (!bVar1) {
                  local_210 = ParserBase::expect(&this->super_ParserBase,Colon);
                  goto LAB_0035bd1f;
                }
                bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
              } while (!bVar1);
            }
            local_1f8._M_first._M_storage =
                 (_Uninitialized<slang::parsing::Token,_true>)
                 ParserBase::expect(&this->super_ParserBase,Comma);
            local_1e8 = local_1e8 & 0xffffffffffffff00;
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                       (TokenOrSyntax *)&local_1f8._M_first);
            TVar15 = ParserBase::peek(&this->super_ParserBase);
            pIVar9 = TVar15.info;
            TVar11 = TVar15.kind;
            bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar11);
            if (TVar11 == EndOfFile || bVar1) {
              ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
              goto LAB_0035bd14;
            }
            TVar12 = TVar14.kind;
            uVar13 = TVar15._0_8_ & 0xffffffff;
            TVar14.info = pIVar9;
            TVar14.kind = (short)uVar13;
            TVar14._2_1_ = (char)(uVar13 >> 0x10);
            TVar14.numFlags.raw = (char)(uVar13 >> 0x18);
            TVar14.rawLen = (int)(uVar13 >> 0x20);
          } while (pIVar10 != pIVar9 || TVar12 != TVar11);
          bVar1 = ParserBase::
                  skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                            (&this->super_ParserBase,(DiagCode)0x10001,true);
          uVar13 = TVar15._0_8_ & 0xffffffff;
          TVar14.kind = (short)uVar13;
          TVar14._2_1_ = (char)(uVar13 >> 0x10);
          TVar14.numFlags.raw = (char)(uVar13 >> 0x18);
          TVar14.rawLen = (int)(uVar13 >> 0x20);
        } while (bVar1);
LAB_0035bd14:
        local_210 = ParserBase::expect(&this->super_ParserBase,Colon);
        goto LAB_0035bd1f;
      }
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar14,Colon,&local_210,(DiagCode)0x10001);
      pIVar10 = extraout_RDX;
    }
    iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar10);
    TVar14 = local_210;
    local_1d0 = CONCAT44(extraout_var,iVar2);
    local_1f8._8_4_ = 3;
    local_1e8 = 0;
    uStack_1e0 = 0;
    local_1f8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005966a8;
    in_RCX = local_210.info;
    pMVar6 = parseGenerateBlock(this);
    pSVar7 = slang::syntax::SyntaxFactory::standardCaseItem
                       (this_00,(SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                                &local_1f8._M_first,TVar14,&pMVar6->super_SyntaxNode);
    current._0_8_ = pSVar7;
    ctx = &current;
    SmallVectorBase<slang::syntax::CaseItemSyntax*>::emplace_back<slang::syntax::CaseItemSyntax*>
              ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)&itemBuffer,(CaseItemSyntax **)ctx
              );
    SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
              (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,(EVP_PKEY_CTX *)ctx);
  } while( true );
}

Assistant:

CaseGenerateSyntax& Parser::parseCaseGenerateConstruct(AttrList attributes) {
    auto keyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& condition = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);

    SmallVector<CaseItemSyntax*> itemBuffer;
    SourceLocation lastDefault;
    bool errored = false;

    while (true) {
        auto kind = peek().kind;
        if (kind == TokenKind::DefaultKeyword) {
            if (lastDefault && !errored) {
                auto& diag = addDiag(diag::MultipleGenerateDefaultCases, peek().location());
                diag.addNote(diag::NotePreviousDefinition, lastDefault);
                errored = true;
            }

            lastDefault = peek().location();

            auto def = consume();
            auto colon = consumeIf(TokenKind::Colon);
            itemBuffer.push_back(&factory.defaultCaseItem(def, colon, parseGenerateBlock()));
        }
        else if (isPossibleExpression(kind)) {
            Token colon;
            SmallVector<TokenOrSyntax, 8> buffer;
            parseList<isPossibleExpressionOrComma, isEndOfCaseItem>(
                buffer, TokenKind::Colon, TokenKind::Comma, colon, RequireItems::True,
                diag::ExpectedExpression, [this] { return &parseExpression(); });
            itemBuffer.push_back(
                &factory.standardCaseItem(buffer.copy(alloc), colon, parseGenerateBlock()));
        }
        else {
            break;
        }
    }

    if (itemBuffer.empty())
        addDiag(diag::CaseGenerateEmpty, keyword.location());

    auto endcase = expect(TokenKind::EndCaseKeyword);
    return factory.caseGenerate(attributes, keyword, openParen, condition, closeParen,
                                itemBuffer.copy(alloc), endcase);
}